

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O3

float plutovg_font_face_traverse_glyph_path
                (plutovg_font_face_t *face,float size,float x,float y,plutovg_codepoint_t codepoint,
                plutovg_path_traverse_func_t traverse_func,void *closure)

{
  ulong uVar1;
  ushort uVar2;
  stbtt_vertex *psVar3;
  undefined1 auVar4 [12];
  glyph_t *pgVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  plutovg_path_command_t pVar9;
  float fVar10;
  float fVar15;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  plutovg_matrix_t matrix;
  undefined8 local_98;
  plutovg_point_t local_88;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  plutovg_matrix_t local_70;
  float local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar12 [16];
  undefined2 uVar14;
  
  uVar2 = *(ushort *)((face->info).data + (long)(face->info).head + 0x12);
  local_58 = size / (float)(ushort)(uVar2 << 8 | uVar2 >> 8);
  plutovg_matrix_init_translate(&local_70,x,y);
  plutovg_matrix_scale(&local_70,local_58,-local_58);
  pgVar5 = plutovg_font_face_get_glyph(face,codepoint);
  if (0 < pgVar5->nvertices) {
    local_98 = 0;
    lVar8 = 0;
    lVar7 = 0;
    do {
      psVar3 = pgVar5->vertices;
      switch((&psVar3->type)[lVar8]) {
      case '\x01':
        auVar13 = ZEXT416(*(uint *)((long)&psVar3->x + lVar8));
        auVar13 = pshuflw(auVar13,auVar13,0x60);
        local_88.x = (float)(auVar13._0_4_ >> 0x10);
        local_88.y = (float)(auVar13._4_4_ >> 0x10);
        local_98 = CONCAT44(local_88.y,local_88.x);
        plutovg_matrix_map_points(&local_70,&local_88,&local_88,1);
        pVar9 = PLUTOVG_PATH_COMMAND_MOVE_TO;
        break;
      case '\x02':
        auVar13 = ZEXT416(*(uint *)((long)&psVar3->x + lVar8));
        auVar13 = pshuflw(auVar13,auVar13,0x60);
        local_88.x = (float)(auVar13._0_4_ >> 0x10);
        local_88.y = (float)(auVar13._4_4_ >> 0x10);
        local_98 = CONCAT44(local_88.y,local_88.x);
        plutovg_matrix_map_points(&local_70,&local_88,&local_88,1);
        pVar9 = PLUTOVG_PATH_COMMAND_LINE_TO;
        break;
      case '\x03':
        auVar13 = ZEXT416(*(uint *)((long)&psVar3->x + lVar8));
        auVar13 = pshuflw(auVar13,auVar13,0x60);
        local_48 = (float)(auVar13._0_4_ >> 0x10);
        fStack_44 = (float)(auVar13._4_4_ >> 0x10);
        fStack_40 = (float)(auVar13._8_4_ >> 0x10);
        fStack_3c = (float)(auVar13._12_4_ >> 0x10);
        auVar13 = ZEXT416(*(uint *)((long)&psVar3->cx + lVar8));
        auVar13 = pshuflw(auVar13,auVar13,0x60);
        fVar10 = (float)(auVar13._0_4_ >> 0x10);
        fVar15 = (float)(auVar13._4_4_ >> 0x10);
        local_88.x = fVar10 * 0.6666667 + (float)local_98 * 0.33333334;
        local_88.y = fVar15 * 0.6666667 + local_98._4_4_ * 0.33333334;
        fStack_80 = fVar10 * 0.6666667 + local_48 * 0.33333334;
        fStack_7c = fVar15 * 0.6666667 + fStack_44 * 0.33333334;
        local_78 = CONCAT44(fStack_44,local_48);
        plutovg_matrix_map_points(&local_70,&local_88,&local_88,3);
        (*traverse_func)(closure,PLUTOVG_PATH_COMMAND_CUBIC_TO,&local_88,3);
        local_98 = CONCAT44(fStack_44,local_48);
        goto LAB_0010478f;
      case '\x04':
        uVar1 = *(ulong *)((long)&psVar3->cx + lVar8);
        uVar14 = (undefined2)(uVar1 >> 0x30);
        auVar12._8_4_ = 0;
        auVar12._0_8_ = uVar1;
        auVar12._12_2_ = uVar14;
        auVar12._14_2_ = uVar14;
        uVar14 = (undefined2)(uVar1 >> 0x20);
        auVar11._12_4_ = auVar12._12_4_;
        auVar11._8_2_ = 0;
        auVar11._0_8_ = uVar1;
        auVar11._10_2_ = uVar14;
        auVar13._10_6_ = auVar11._10_6_;
        auVar13._8_2_ = uVar14;
        auVar13._0_8_ = uVar1;
        uVar14 = (undefined2)(uVar1 >> 0x10);
        auVar4._4_8_ = auVar13._8_8_;
        auVar4._2_2_ = uVar14;
        auVar4._0_2_ = uVar14;
        local_88.x = (float)(int)(short)uVar1;
        local_88.y = (float)(auVar4._0_4_ >> 0x10);
        fStack_80 = (float)(auVar13._8_4_ >> 0x10);
        fStack_7c = (float)(auVar11._12_4_ >> 0x10);
        auVar13 = ZEXT416(*(uint *)((long)&psVar3->x + lVar8));
        auVar13 = pshuflw(auVar13,auVar13,0x60);
        fVar10 = (float)(auVar13._0_4_ >> 0x10);
        fVar15 = (float)(auVar13._4_4_ >> 0x10);
        local_98 = CONCAT44(fVar15,fVar10);
        local_78 = CONCAT44(fVar15,fVar10);
        plutovg_matrix_map_points(&local_70,&local_88,&local_88,3);
        pVar9 = PLUTOVG_PATH_COMMAND_CUBIC_TO;
        iVar6 = 3;
        goto LAB_0010478c;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-font.c"
                      ,0x166,
                      "float plutovg_font_face_traverse_glyph_path(plutovg_font_face_t *, float, float, float, plutovg_codepoint_t, plutovg_path_traverse_func_t, void *)"
                     );
      }
      iVar6 = 1;
LAB_0010478c:
      (*traverse_func)(closure,pVar9,&local_88,iVar6);
LAB_0010478f:
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0xe;
    } while (lVar7 < pgVar5->nvertices);
  }
  return local_58 * (float)pgVar5->advance_width;
}

Assistant:

float plutovg_font_face_traverse_glyph_path(plutovg_font_face_t* face, float size, float x, float y, plutovg_codepoint_t codepoint, plutovg_path_traverse_func_t traverse_func, void* closure)
{
    float scale = plutovg_font_face_get_scale(face, size);
    plutovg_matrix_t matrix;
    plutovg_matrix_init_translate(&matrix, x, y);
    plutovg_matrix_scale(&matrix, scale, -scale);

    plutovg_point_t points[3];
    plutovg_point_t current_point = {0, 0};
    glyph_t* glyph = plutovg_font_face_get_glyph(face, codepoint);
    for(int i = 0; i < glyph->nvertices; i++) {
        switch(glyph->vertices[i].type) {
        case STBTT_vmove:
            points[0].x = glyph->vertices[i].x;
            points[0].y = glyph->vertices[i].y;
            current_point = points[0];
            plutovg_matrix_map_points(&matrix, points, points, 1);
            traverse_func(closure, PLUTOVG_PATH_COMMAND_MOVE_TO, points, 1);
            break;
        case STBTT_vline:
            points[0].x = glyph->vertices[i].x;
            points[0].y = glyph->vertices[i].y;
            current_point = points[0];
            plutovg_matrix_map_points(&matrix, points, points, 1);
            traverse_func(closure, PLUTOVG_PATH_COMMAND_LINE_TO, points, 1);
            break;
        case STBTT_vcurve:
            points[0].x = 2.f / 3.f * glyph->vertices[i].cx + 1.f / 3.f * current_point.x;
            points[0].y = 2.f / 3.f * glyph->vertices[i].cy + 1.f / 3.f * current_point.y;
            points[1].x = 2.f / 3.f * glyph->vertices[i].cx + 1.f / 3.f * glyph->vertices[i].x;
            points[1].y = 2.f / 3.f * glyph->vertices[i].cy + 1.f / 3.f * glyph->vertices[i].y;
            points[2].x = glyph->vertices[i].x;
            points[2].y = glyph->vertices[i].y;
            current_point = points[2];
            plutovg_matrix_map_points(&matrix, points, points, 3);
            traverse_func(closure, PLUTOVG_PATH_COMMAND_CUBIC_TO, points, 3);
            break;
        case STBTT_vcubic:
            points[0].x = glyph->vertices[i].cx;
            points[0].y = glyph->vertices[i].cy;
            points[1].x = glyph->vertices[i].cx1;
            points[1].y = glyph->vertices[i].cy1;
            points[2].x = glyph->vertices[i].x;
            points[2].y = glyph->vertices[i].y;
            current_point = points[2];
            plutovg_matrix_map_points(&matrix, points, points, 3);
            traverse_func(closure, PLUTOVG_PATH_COMMAND_CUBIC_TO, points, 3);
            break;
        default:
            assert(false);
        }
    }

    return glyph->advance_width * scale;
}